

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O3

void __thiscall
kj::ExceptionCallback::RootExceptionCallback::logException
          (RootExceptionCallback *this,LogSeverity severity,Exception *e)

{
  uint uVar1;
  char *pcVar2;
  ulong uVar3;
  ArrayPtr<void_*const> trace;
  size_t sVar4;
  ExceptionCallback *pEVar5;
  char *pcVar6;
  char *pcVar7;
  bool bVar8;
  char (*in_stack_ffffffffffffff28) [2];
  Type local_cc;
  String local_c8;
  String local_a8;
  String local_88;
  char *local_68;
  char *local_50;
  ulong local_48;
  char *local_40;
  ulong local_38;
  
  pEVar5 = getExceptionCallback();
  pcVar2 = e->file;
  uVar1 = e->line;
  local_cc = e->type;
  local_38 = (e->description).content.size_;
  local_40 = "";
  if (local_38 != 0) {
    local_40 = (e->description).content.ptr;
  }
  bVar8 = local_38 < 2;
  if (bVar8) {
    local_38 = 1;
  }
  pcVar7 = ": ";
  if (bVar8) {
    pcVar7 = "";
  }
  uVar3 = (e->remoteTrace).content.size_;
  local_50 = "";
  if (uVar3 != 0) {
    local_50 = (e->remoteTrace).content.ptr;
  }
  local_48 = 1;
  if (1 < uVar3) {
    local_48 = uVar3;
  }
  pcVar6 = "\nremote: ";
  if (1 >= uVar3) {
    pcVar6 = "";
  }
  local_c8.content.ptr = (char *)e->trace;
  local_c8.content.size_ = (size_t)e->traceCount;
  local_68 = "\nstack: ";
  if ((char *)local_c8.content.size_ == (char *)0x0) {
    local_68 = "";
  }
  strArray<kj::ArrayPtr<void*const>&>
            (&local_88,(kj *)&local_c8,(ArrayPtr<void_*const> *)0x52954f,
             (char *)local_c8.content.size_);
  trace.size_ = (size_t)pcVar7;
  trace.ptr = (void **)pcVar6;
  stringifyStackTrace(trace);
  str<kj::Exception::Type,char_const*,kj::StringPtr,char_const*,kj::StringPtr,char_const*,kj::String,kj::String,char_const(&)[2]>
            (&local_a8,(kj *)&local_cc,(Type *)&stack0xffffffffffffffa8,&local_40,
             (StringPtr *)&stack0xffffffffffffffa0,&local_50,(StringPtr *)&local_68,
             (char **)&local_88,&local_c8,(String *)0x58888e,in_stack_ffffffffffffff28);
  (*pEVar5->_vptr_ExceptionCallback[4])(pEVar5,(ulong)severity,pcVar2,(ulong)uVar1,0,&local_a8);
  sVar4 = local_a8.content.size_;
  pcVar2 = local_a8.content.ptr;
  if (local_a8.content.ptr != (char *)0x0) {
    local_a8.content.ptr = (char *)0x0;
    local_a8.content.size_ = 0;
    (**(local_a8.content.disposer)->_vptr_ArrayDisposer)
              (local_a8.content.disposer,pcVar2,1,sVar4,sVar4,0);
  }
  sVar4 = local_c8.content.size_;
  pcVar2 = local_c8.content.ptr;
  if ((void **)local_c8.content.ptr != (void **)0x0) {
    local_c8.content.ptr = (char *)0x0;
    local_c8.content.size_ = 0;
    (**(local_c8.content.disposer)->_vptr_ArrayDisposer)
              (local_c8.content.disposer,pcVar2,1,sVar4,sVar4,0);
  }
  sVar4 = local_88.content.size_;
  pcVar2 = local_88.content.ptr;
  if (local_88.content.ptr != (char *)0x0) {
    local_88.content.ptr = (char *)0x0;
    local_88.content.size_ = 0;
    (**(local_88.content.disposer)->_vptr_ArrayDisposer)
              (local_88.content.disposer,pcVar2,1,sVar4,sVar4,0);
  }
  return;
}

Assistant:

void logException(LogSeverity severity, Exception&& e) {
    // We intentionally go back to the top exception callback on the stack because we don't want to
    // bypass whatever log processing is in effect.
    //
    // We intentionally don't log the context since it should get re-added by the exception callback
    // anyway.
    getExceptionCallback().logMessage(severity, e.getFile(), e.getLine(), 0, str(
        e.getType(), e.getDescription() == nullptr ? "" : ": ", e.getDescription(),
        e.getRemoteTrace().size() > 0 ? "\nremote: " : "",
        e.getRemoteTrace(),
        e.getStackTrace().size() > 0 ? "\nstack: " : "",
        stringifyStackTraceAddresses(e.getStackTrace()),
        stringifyStackTrace(e.getStackTrace()), "\n"));
  }